

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode Curl_connect(Curl_easy *data,_Bool *asyncp,_Bool *protocol_done)

{
  char **ppcVar1;
  undefined1 *puVar2;
  Curl_handler *pCVar3;
  void *pvVar4;
  bool bVar5;
  undefined4 uVar6;
  _Bool _Var7;
  byte bVar8;
  ushort uVar9;
  uint uVar10;
  CURLUcode CVar11;
  int iVar12;
  CURLcode CVar13;
  CURLcode CVar14;
  connectdata *conn;
  char *pcVar15;
  CURLU *u;
  size_t sVar16;
  size_t sVar17;
  stsentry *psVar18;
  long lVar19;
  curl_trc_feat *pcVar20;
  ulong uVar21;
  ulong uVar22;
  char *v;
  ConnectBits CVar23;
  urlpieces *puVar24;
  connectdata *conn_00;
  char *pcVar25;
  char *pcVar26;
  curltime cVar27;
  _Bool waitpipe;
  _Bool force_reuse;
  char *newurl;
  connectdata *existing;
  _Bool local_79;
  urlpieces *local_78;
  _Bool local_69;
  char *local_68 [3];
  proxy_info *local_50;
  _Bool *local_48;
  _Bool *local_40;
  connectdata *local_38;
  
  *asyncp = false;
  Curl_req_hard_reset(&data->req,data);
  local_38 = (connectdata *)0x0;
  local_69 = false;
  local_79 = false;
  *asyncp = false;
  CVar14 = CURLE_URL_MALFORMAT;
  conn = (connectdata *)0x0;
  CVar13 = CVar14;
  if ((data->state).url == (char *)0x0) goto switchD_0015dfb7_caseD_1;
  conn = (connectdata *)(*Curl_ccalloc)(1,0x588);
  if (conn == (connectdata *)0x0) {
LAB_0015e008:
    conn = (connectdata *)0x0;
    goto switchD_0015dfb7_caseD_7;
  }
  conn->sock[0] = -1;
  conn->sock[1] = -1;
  conn->sockfd = -1;
  conn->writesockfd = -1;
  conn->connection_id = -1;
  (conn->primary).remote_port = -1;
  conn->remote_port = -1;
  Curl_conncontrol(conn,1);
  cVar27 = Curl_now();
  (conn->created).tv_sec = cVar27.tv_sec;
  (conn->created).tv_usec = cVar27.tv_usec;
  (conn->keepalive).tv_sec = (conn->created).tv_sec;
  (conn->keepalive).tv_usec = (conn->created).tv_usec;
  *(undefined4 *)&(conn->keepalive).field_0xc = *(undefined4 *)&(conn->created).field_0xc;
  bVar8 = (data->set).proxytype;
  (conn->http_proxy).proxytype = bVar8;
  (conn->socks_proxy).proxytype = '\x04';
  pcVar15 = (data->set).str[0x26];
  if ((pcVar15 == (char *)0x0) || (*pcVar15 == '\0')) {
    uVar21 = (ulong)conn->bits & 0xffffffffffffffef;
    uVar22 = 0;
  }
  else {
    uVar21 = (ulong)conn->bits | 0x10;
    uVar22 = 1;
    if (2 < bVar8) {
      uVar22 = (ulong)(bVar8 == 3);
    }
  }
  CVar23 = (ConnectBits)
           ((ulong)(((int)uVar22 * 2 ^ 2U) & (uint)(uVar21 >> 3) & 0x1fffffff) |
            uVar21 & 0xfffffffffffffffc | uVar22);
  conn->bits = CVar23;
  pcVar15 = (data->set).str[0x27];
  if ((pcVar15 != (char *)0x0) && (*pcVar15 != '\0')) {
    CVar23 = (ConnectBits)((ulong)CVar23 | 0x12);
    conn->bits = CVar23;
  }
  CVar23 = (ConnectBits)
           (((ulong)CVar23 & 0xfffffffffffffffb) +
           (ulong)((data->state).aptr.proxyuser != (char *)0x0) * 4);
  conn->bits = CVar23;
  uVar21 = (ulong)(*(uint *)&(data->set).field_0x8ca >> 5 & 8);
  conn->bits = (ConnectBits)((ulong)CVar23 & 0xfffffffffffffff7 | uVar21);
  CVar23 = (ConnectBits)
           (((ulong)CVar23 & 0xffffffffffff7ff7 | uVar21) +
           (ulong)(*(uint *)&(data->set).field_0x8ca & 0x2000) * 4);
  conn->bits = CVar23;
  conn->bits = (ConnectBits)
               (((ulong)CVar23 & 0xfffffffffffeffff) +
               (ulong)(*(uint *)&(data->set).field_0x8ca & 0x4000) * 4);
  conn->ip_version = (data->set).ipver;
  conn->connect_only = (data->set).connect_only;
  conn->transport = '\x03';
  Curl_llist_init(&conn->easyq,(Curl_llist_dtor)0x0);
  pcVar15 = (data->set).str[0x1e];
  if (pcVar15 != (char *)0x0) {
    pcVar15 = (*Curl_cstrdup)(pcVar15);
    conn->localdev = pcVar15;
    if (pcVar15 == (char *)0x0) {
      (*Curl_cfree)((void *)0x0);
      (*Curl_cfree)(conn);
      goto LAB_0015e008;
    }
  }
  conn->localportrange = (data->set).localportrange;
  conn->localport = (data->set).localport;
  pvVar4 = (data->set).closesocket_client;
  conn->fclosesocket = (data->set).fclosesocket;
  conn->closesocket_client = pvVar4;
  iVar12 = (conn->created).tv_usec;
  uVar6 = *(undefined4 *)&(conn->created).field_0xc;
  (conn->lastused).tv_sec = (conn->created).tv_sec;
  (conn->lastused).tv_usec = iVar12;
  *(undefined4 *)&(conn->lastused).field_0xc = uVar6;
  conn->gssapi_delegation = (data->set).gssapi_delegation;
  local_48 = asyncp;
  local_40 = protocol_done;
  if ((data->set).uh == (CURLU *)0x0) {
    up_free(data);
LAB_0015dee5:
    bVar5 = false;
    u = curl_url();
  }
  else {
    bVar8 = (data->state).field_0x774;
    up_free(data);
    if ((bVar8 & 2) != 0) goto LAB_0015dee5;
    u = curl_url_dup((data->set).uh);
    bVar5 = true;
  }
  (data->state).uh = u;
  if (u == (CURLU *)0x0) goto switchD_0015dfb7_caseD_7;
  if (((data->set).str[0x1d] != (char *)0x0) &&
     (sVar16 = Curl_is_absolute_url((data->state).url,(char *)0x0,0,true), sVar16 == 0)) {
    pcVar15 = curl_maprintf("%s://%s",(data->set).str[0x1d],(data->state).url);
    if (pcVar15 == (char *)0x0) goto switchD_0015dfb7_caseD_7;
    uVar10 = *(uint *)&(data->state).field_0x774;
    if ((uVar10 >> 0xe & 1) != 0) {
      (*Curl_cfree)((data->state).url);
      uVar10 = *(uint *)&(data->state).field_0x774;
    }
    (data->state).url = pcVar15;
    *(uint *)&(data->state).field_0x774 = uVar10 | 0x4000;
  }
  if (!bVar5) {
    uVar10 = (uint)((ulong)*(undefined8 *)&(data->set).field_0x8ca >> 0x20);
    CVar11 = curl_url_set(u,CURLUPART_URL,(data->state).url,
                          (uVar10 >> 10 & 0x20) + (uVar10 >> 5 & 0x10) + 0x208);
    if (CVar11 == CURLUE_OK) {
      CVar11 = curl_url_get(u,CURLUPART_URL,local_68,0);
      CVar13 = CURLE_URL_MALFORMAT;
      switch(CVar11) {
      case CURLUE_OK:
        uVar10 = *(uint *)&(data->state).field_0x774;
        if ((uVar10 >> 0xe & 1) != 0) {
          (*Curl_cfree)((data->state).url);
          uVar10 = *(uint *)&(data->state).field_0x774;
        }
        (data->state).url = local_68[0];
        *(uint *)&(data->state).field_0x774 = uVar10 | 0x4000;
        goto LAB_0015df89;
      case CURLUE_UNSUPPORTED_SCHEME:
        CVar13 = CURLE_UNSUPPORTED_PROTOCOL;
        break;
      case CURLUE_OUT_OF_MEMORY:
        CVar13 = CURLE_OUT_OF_MEMORY;
        break;
      case CURLUE_USER_NOT_ALLOWED:
        CVar13 = CURLE_LOGIN_DENIED;
      }
    }
    else {
      pcVar15 = curl_url_strerror(CVar11);
      Curl_failf(data,"URL rejected: %s",pcVar15);
      CVar13 = CURLE_URL_MALFORMAT;
      if (CVar11 - CURLUE_UNSUPPORTED_SCHEME < 4) {
        CVar13 = *(CURLcode *)(&DAT_0017cb98 + (ulong)(CVar11 - CURLUE_UNSUPPORTED_SCHEME) * 4);
      }
    }
    goto switchD_0015dfb7_caseD_1;
  }
LAB_0015df89:
  puVar24 = &(data->state).up;
  CVar11 = curl_url_get(u,CURLUPART_SCHEME,&puVar24->scheme,0);
  CVar13 = CVar14;
  switch(CVar11) {
  case CURLUE_OK:
    ppcVar1 = &(data->state).up.hostname;
    CVar11 = curl_url_get(u,CURLUPART_HOST,ppcVar1,0);
    if (CVar11 == CURLUE_OK) {
      pcVar15 = *ppcVar1;
      sVar17 = strlen(pcVar15);
      if (0xffff < sVar17) {
        Curl_failf(data,"Too long hostname (maximum is %d)",0xffff);
        goto switchD_0015dfb7_caseD_1;
      }
    }
    else {
      iVar12 = curl_strequal("file",puVar24->scheme);
      if (iVar12 == 0) goto switchD_0015dfb7_caseD_7;
      pcVar15 = *ppcVar1;
    }
    local_78 = puVar24;
    if (pcVar15 == (char *)0x0) {
      pcVar25 = (char *)0x0;
    }
    else {
      pcVar25 = pcVar15;
      if (*pcVar15 == '[') {
        puVar2 = &(conn->bits).field_0x1;
        *puVar2 = *puVar2 | 4;
        pcVar25 = pcVar15 + 1;
        sVar17 = strlen(pcVar25);
        pcVar15[sVar17] = '\0';
        zonefrom_url(u,data,conn);
      }
    }
    if (pcVar25 == (char *)0x0) {
      pcVar25 = "";
    }
    pcVar15 = (*Curl_cstrdup)(pcVar25);
    (conn->host).rawalloc = pcVar15;
    if (pcVar15 == (char *)0x0) goto switchD_0015dfb7_caseD_7;
    (conn->host).name = pcVar15;
    CVar13 = Curl_idnconvert_hostname(&conn->host);
    if (CVar13 != CURLE_OK) goto switchD_0015dfb7_caseD_1;
    if (((data->hsts != (hsts *)0x0) &&
        (iVar12 = curl_strequal("http",local_78->scheme), iVar12 != 0)) &&
       (psVar18 = Curl_hsts(data->hsts,(conn->host).name,true), puVar24 = local_78,
       psVar18 != (stsentry *)0x0)) {
      (*Curl_cfree)(local_78->scheme);
      puVar24->scheme = (char *)0x0;
      CVar11 = curl_url_set(u,CURLUPART_SCHEME,"https",0);
      CVar13 = CURLE_URL_MALFORMAT;
      switch(CVar11) {
      case CURLUE_OK:
        if (((data->state).field_0x775 & 0x40) != 0) {
          (*Curl_cfree)((data->state).url);
          (data->state).url = (char *)0x0;
        }
        CVar11 = curl_url_get(u,CURLUPART_URL,local_68,0);
        switch(CVar11) {
        case CURLUE_OK:
          CVar11 = curl_url_get(u,CURLUPART_SCHEME,&local_78->scheme,0);
          local_50 = (proxy_info *)CONCAT44(local_50._4_4_,CVar11);
          if (CVar11 == CURLUE_OK) {
            (data->state).url = local_68[0];
            puVar2 = &(data->state).field_0x775;
            *puVar2 = *puVar2 | 0x40;
            if ((((data->set).field_0x8cd & 0x10) != 0) &&
               ((pcVar20 = (data->state).feat, pcVar20 == (curl_trc_feat *)0x0 ||
                (0 < pcVar20->log_level)))) {
              Curl_infof(data,"Switched from HTTP to HTTPS due to HSTS => %s");
            }
            goto LAB_0015e37d;
          }
          (*Curl_cfree)(local_68[0]);
          if ((int)local_50 - 5U < 4) {
            CVar13 = *(CURLcode *)(&DAT_0017cb98 + (ulong)((int)local_50 - 5U) * 4);
          }
          break;
        case CURLUE_UNSUPPORTED_SCHEME:
          goto switchD_0015e290_caseD_5;
        case CURLUE_OUT_OF_MEMORY:
          goto switchD_0015e290_caseD_7;
        case CURLUE_USER_NOT_ALLOWED:
          goto switchD_0015e290_caseD_8;
        }
        break;
      case CURLUE_UNSUPPORTED_SCHEME:
switchD_0015e290_caseD_5:
        CVar13 = CURLE_UNSUPPORTED_PROTOCOL;
        break;
      case CURLUE_OUT_OF_MEMORY:
switchD_0015e290_caseD_7:
        CVar13 = CURLE_OUT_OF_MEMORY;
        break;
      case CURLUE_USER_NOT_ALLOWED:
switchD_0015e290_caseD_8:
        CVar13 = CURLE_LOGIN_DENIED;
      }
      goto switchD_0015dfb7_caseD_1;
    }
LAB_0015e37d:
    CVar13 = findprotocol(data,conn,(data->state).up.scheme);
    if (CVar13 != CURLE_OK) goto switchD_0015dfb7_caseD_5;
    if ((data->set).str[0x2e] == (char *)0x0) {
      ppcVar1 = &(data->state).up.password;
      CVar11 = curl_url_get(u,CURLUPART_PASSWORD,ppcVar1,0);
      switch(CVar11) {
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_0015dfb7_caseD_5;
      case CURLUE_URLDECODE:
      case CURLUE_UNKNOWN_PART:
      case CURLUE_NO_SCHEME:
      case CURLUE_NO_USER:
switchD_0015e41c_caseD_6:
        CVar13 = CURLE_URL_MALFORMAT;
        goto switchD_0015dfb7_caseD_1;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_0015dfb7_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_0015dfb7_caseD_8;
      case CURLUE_NO_PASSWORD:
        break;
      default:
        if (CVar11 != CURLUE_OK) goto switchD_0015e41c_caseD_6;
        CVar13 = Curl_urldecode(*ppcVar1,0,local_68,(size_t *)0x0,
                                ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
        if (CVar13 != CURLE_OK) goto switchD_0015dfb7_caseD_1;
        conn->passwd = local_68[0];
        CVar13 = Curl_setstropt(&(data->state).aptr.passwd,local_68[0]);
        if (CVar13 != CURLE_OK) goto switchD_0015dfb7_caseD_1;
      }
    }
    if ((data->set).str[0x2d] == (char *)0x0) {
      ppcVar1 = &(data->state).up.user;
      CVar11 = curl_url_get(u,CURLUPART_USER,ppcVar1,0);
      CVar13 = CVar14;
      switch(CVar11) {
      case CURLUE_OK:
        CVar13 = Curl_urldecode(*ppcVar1,0,local_68,(size_t *)0x0,
                                ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
        if (CVar13 != CURLE_OK) goto switchD_0015dfb7_caseD_1;
        conn->user = local_68[0];
        break;
      default:
        goto switchD_0015dfb7_caseD_1;
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_0015dfb7_caseD_5;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_0015dfb7_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_0015dfb7_caseD_8;
      case CURLUE_NO_USER:
        if ((data->state).aptr.passwd == (char *)0x0) goto LAB_0015e3b1;
        local_68[0] = "";
      }
      CVar13 = Curl_setstropt(&(data->state).aptr.user,local_68[0]);
      if (CVar13 != CURLE_OK) goto switchD_0015dfb7_caseD_1;
    }
    break;
  default:
    goto switchD_0015dfb7_caseD_1;
  case CURLUE_UNSUPPORTED_SCHEME:
    goto switchD_0015dfb7_caseD_5;
  case CURLUE_OUT_OF_MEMORY:
    goto switchD_0015dfb7_caseD_7;
  case CURLUE_USER_NOT_ALLOWED:
switchD_0015dfb7_caseD_8:
    CVar13 = CURLE_LOGIN_DENIED;
    goto switchD_0015dfb7_caseD_1;
  }
LAB_0015e3b1:
  ppcVar1 = &(data->state).up.options;
  CVar11 = curl_url_get(u,CURLUPART_OPTIONS,ppcVar1,0x40);
  CVar13 = CVar14;
  switch(CVar11) {
  case CURLUE_UNSUPPORTED_SCHEME:
switchD_0015dfb7_caseD_5:
    CVar13 = CURLE_UNSUPPORTED_PROTOCOL;
    break;
  case CURLUE_URLDECODE:
  case CURLUE_UNKNOWN_PART:
  case CURLUE_NO_SCHEME:
  case CURLUE_NO_USER:
  case CURLUE_NO_PASSWORD:
    break;
  case CURLUE_USER_NOT_ALLOWED:
    goto switchD_0015dfb7_caseD_8;
  case CURLUE_NO_OPTIONS:
switchD_0015e3e7_caseD_d:
    CVar11 = curl_url_get(u,CURLUPART_PATH,&(data->state).up.path,0x80);
    switch(CVar11) {
    case CURLUE_OK:
      CVar11 = curl_url_get(u,CURLUPART_PORT,&(data->state).up.port,1);
      if (CVar11 == CURLUE_OK) {
        uVar21 = strtoul((data->state).up.port,(char **)0x0,10);
        uVar9 = (data->set).use_port;
        if ((uVar9 == 0) || (((data->state).field_0x774 & 0x10) == 0)) {
          uVar9 = curlx_ultous(uVar21);
        }
        conn->remote_port = (uint)uVar9;
        (conn->primary).remote_port = (uint)uVar9;
      }
      else {
        iVar12 = curl_strequal("file",local_78->scheme);
        if (iVar12 == 0) goto switchD_0015dfb7_caseD_7;
      }
      curl_url_get(u,CURLUPART_QUERY,&(data->state).up.query,0);
      uVar10 = (data->set).scope_id;
      if (uVar10 != 0) {
        conn->scope_id = uVar10;
      }
      pcVar15 = (data->set).str[0x42];
      if (pcVar15 != (char *)0x0) {
        pcVar15 = (*Curl_cstrdup)(pcVar15);
        conn->sasl_authzid = pcVar15;
        if (pcVar15 == (char *)0x0) goto switchD_0015dfb7_caseD_7;
      }
      pcVar15 = (data->set).str[0x3c];
      if (pcVar15 != (char *)0x0) {
        pcVar15 = (*Curl_cstrdup)(pcVar15);
        conn->oauth_bearer = pcVar15;
        if (pcVar15 == (char *)0x0) goto switchD_0015dfb7_caseD_7;
      }
      pcVar15 = (data->set).str[0x3d];
      if (pcVar15 == (char *)0x0) {
        CVar23 = conn->bits;
      }
      else {
        pcVar15 = (*Curl_cstrdup)(pcVar15);
        conn->unix_domain_socket = pcVar15;
        if (pcVar15 == (char *)0x0) goto switchD_0015dfb7_caseD_7;
        CVar23 = (ConnectBits)
                 ((ulong)conn->bits & 0xfffffffffbffffff |
                 (ulong)((uint)(*(ulong *)&(data->set).field_0x8ca >> 0x14) & 0x4000000));
        conn->bits = CVar23;
      }
      if (((ulong)CVar23 & 4) == 0) {
LAB_0015e71d:
        pcVar15 = (data->set).str[0x26];
        if (pcVar15 == (char *)0x0) {
          pcVar15 = (char *)0x0;
        }
        else {
          pcVar15 = (*Curl_cstrdup)(pcVar15);
          if (pcVar15 == (char *)0x0) {
            Curl_failf(data,"memory shortage");
            CVar13 = CURLE_OUT_OF_MEMORY;
            goto LAB_0015e96c;
          }
        }
        pcVar25 = (data->set).str[0x27];
        if (pcVar25 == (char *)0x0) {
          pcVar25 = (char *)0x0;
LAB_0015e78f:
          if ((data->set).str[0x32] == (char *)0x0) {
            pcVar26 = "no_proxy";
            local_78 = (urlpieces *)curl_getenv("no_proxy");
            if (local_78 == (urlpieces *)0x0) {
              pcVar26 = "NO_PROXY";
              local_78 = (urlpieces *)curl_getenv("NO_PROXY");
              if (local_78 == (urlpieces *)0x0) goto LAB_0015e79d;
            }
            if ((((data->set).field_0x8cd & 0x10) != 0) &&
               ((pcVar20 = (data->state).feat, pcVar20 == (curl_trc_feat *)0x0 ||
                (0 < pcVar20->log_level)))) {
              Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcVar26,local_78);
            }
          }
          else {
LAB_0015e79d:
            local_78 = (urlpieces *)0x0;
          }
          puVar24 = (urlpieces *)(data->set).str[0x32];
          if (puVar24 == (urlpieces *)0x0) {
            puVar24 = local_78;
          }
          _Var7 = Curl_check_noproxy((conn->host).name,(char *)puVar24);
          if (_Var7) {
            (*Curl_cfree)(pcVar15);
            (*Curl_cfree)(pcVar25);
            (*Curl_cfree)(local_78);
LAB_0015e9d0:
            uVar21 = (ulong)conn->bits & 0xfffffffffffffffc;
          }
          else {
            if (pcVar15 == (char *)0x0 && pcVar25 == (char *)0x0) {
              pcVar26 = (char *)local_68;
              curl_msnprintf(pcVar26,0x14,"%s_proxy",conn->handler->scheme);
              pcVar15 = curl_getenv(pcVar26);
              if (pcVar15 == (char *)0x0) {
                v = "http_proxy";
                pcVar26 = (char *)local_68;
                iVar12 = curl_strequal("http_proxy",pcVar26);
                if (iVar12 == 0) {
                  Curl_strntoupper(pcVar26,pcVar26,0x14);
                  pcVar15 = curl_getenv(pcVar26);
                  if (pcVar15 != (char *)0x0) goto LAB_0015e824;
                }
                iVar12 = curl_strequal("ws_proxy",(char *)local_68);
                if (iVar12 == 0) {
                  pcVar26 = (char *)local_68;
                  iVar12 = curl_strequal("wss_proxy",pcVar26);
                  if (iVar12 != 0) {
                    pcVar15 = curl_getenv("https_proxy");
                    if (pcVar15 != (char *)0x0) goto LAB_0015e824;
                    v = "HTTPS_PROXY";
                    goto LAB_0015ee0d;
                  }
                }
                else {
LAB_0015ee0d:
                  pcVar15 = curl_getenv(v);
                  if (pcVar15 != (char *)0x0) {
                    pcVar26 = (char *)local_68;
                    goto LAB_0015e824;
                  }
                }
                pcVar26 = "all_proxy";
                pcVar15 = curl_getenv("all_proxy");
                if (pcVar15 == (char *)0x0) {
                  pcVar26 = "ALL_PROXY";
                  pcVar15 = curl_getenv("ALL_PROXY");
                  if (pcVar15 == (char *)0x0) {
                    pcVar15 = (char *)0x0;
                    goto LAB_0015e856;
                  }
                }
              }
LAB_0015e824:
              if ((((data->set).field_0x8cd & 0x10) != 0) &&
                 ((pcVar20 = (data->state).feat, pcVar20 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar20->log_level)))) {
                Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcVar26,pcVar15);
              }
            }
LAB_0015e856:
            (*Curl_cfree)(local_78);
            if (pcVar15 == (char *)0x0) {
LAB_0015e883:
              pcVar15 = (char *)0x0;
            }
            else if (((conn->unix_domain_socket != (char *)0x0) || (*pcVar15 == '\0')) ||
                    ((conn->handler->flags & 0x10) != 0)) {
              (*Curl_cfree)(pcVar15);
              goto LAB_0015e883;
            }
            if (pcVar25 == (char *)0x0) {
LAB_0015e980:
              if (pcVar15 == (char *)0x0) goto LAB_0015e9d0;
              local_78 = (urlpieces *)CONCAT44(local_78._4_4_,(uint)(conn->http_proxy).proxytype);
              pcVar25 = (char *)0x0;
              bVar5 = false;
LAB_0015e9a3:
              local_50 = &conn->http_proxy;
              CVar13 = parse_proxy(data,conn,pcVar15,(curl_proxytype)local_78);
              (*Curl_cfree)(pcVar15);
              if (CVar13 != CURLE_OK) {
                pcVar15 = (char *)0x0;
                goto LAB_0015ea21;
              }
              if (bVar5) goto LAB_0015ed55;
            }
            else {
              if ((*pcVar25 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
                (*Curl_cfree)(pcVar25);
                goto LAB_0015e980;
              }
              local_50 = &conn->http_proxy;
              local_78 = (urlpieces *)CONCAT44(local_78._4_4_,(uint)(conn->http_proxy).proxytype);
              bVar5 = true;
              if (pcVar15 != (char *)0x0) goto LAB_0015e9a3;
LAB_0015ed55:
              CVar13 = parse_proxy(data,conn,pcVar25,(curl_proxytype)local_78);
              (*Curl_cfree)(pcVar25);
              if (CVar13 != CURLE_OK) goto LAB_0015e96c;
            }
            if ((local_50->host).rawalloc == (char *)0x0) {
              CVar23 = (ConnectBits)((ulong)conn->bits & 0xfffffffffffffff6);
              conn->bits = CVar23;
              if ((conn->socks_proxy).host.rawalloc == (char *)0x0) goto LAB_0015ef54;
              if ((conn->socks_proxy).user == (char *)0x0) {
                pcVar15 = (conn->socks_proxy).passwd;
                (conn->socks_proxy).user = (conn->http_proxy).user;
                (conn->http_proxy).user = (char *)0x0;
                (*Curl_cfree)(pcVar15);
                (conn->socks_proxy).passwd = (conn->http_proxy).passwd;
                (conn->http_proxy).passwd = (char *)0x0;
                CVar23 = conn->bits;
              }
            }
            else {
              CVar23 = conn->bits;
              if ((conn->handler->protocol & 0xc0000003) == 0) {
                if (((conn->handler->flags & 0x800) == 0) || (((ulong)CVar23 & 8) != 0)) {
                  CVar23 = (ConnectBits)((ulong)CVar23 | 8);
                }
                else {
                  conn->handler = &Curl_handler_http;
                }
              }
              CVar23 = (ConnectBits)((ulong)CVar23 | 1);
              if ((conn->socks_proxy).host.rawalloc == (char *)0x0) {
LAB_0015ef54:
                uVar21 = (ulong)CVar23 & 0xfffffffffffffffd;
                goto LAB_0015e9db;
              }
            }
            uVar21 = (ulong)CVar23 | 2;
          }
LAB_0015e9db:
          uVar22 = 0x10;
          if ((uVar21 & 1) == 0) {
            uVar22 = (ulong)((int)uVar21 * 8 & 0x10);
          }
          conn->bits = (ConnectBits)(uVar21 & 0xffffffffffffffef | uVar22);
          if (uVar22 == 0) {
            conn->bits = (ConnectBits)(uVar21 & 0xffffffffffffffe0);
            (conn->http_proxy).proxytype = '\0';
          }
          pcVar15 = (char *)0x0;
          pcVar25 = (char *)0x0;
          CVar13 = CURLE_OK;
        }
        else {
          pcVar25 = (*Curl_cstrdup)(pcVar25);
          if (pcVar25 != (char *)0x0) goto LAB_0015e78f;
          pcVar25 = (char *)0x0;
          Curl_failf(data,"memory shortage");
          CVar13 = CURLE_OUT_OF_MEMORY;
        }
      }
      else {
        pcVar15 = (data->state).aptr.proxyuser;
        pcVar25 = (data->state).aptr.proxypasswd;
        if (pcVar15 == (char *)0x0) {
          pcVar15 = "";
        }
        pcVar15 = (*Curl_cstrdup)(pcVar15);
        (conn->http_proxy).user = pcVar15;
        CVar13 = CURLE_OUT_OF_MEMORY;
        if (pcVar15 != (char *)0x0) {
          pcVar15 = "";
          if (pcVar25 != (char *)0x0) {
            pcVar15 = pcVar25;
          }
          pcVar15 = (*Curl_cstrdup)(pcVar15);
          (conn->http_proxy).passwd = pcVar15;
          if (pcVar15 != (char *)0x0) goto LAB_0015e71d;
          (*Curl_cfree)((conn->http_proxy).user);
          (conn->http_proxy).user = (char *)0x0;
        }
LAB_0015e96c:
        pcVar15 = (char *)0x0;
        pcVar25 = (char *)0x0;
      }
LAB_0015ea21:
      (*Curl_cfree)(pcVar25);
      (*Curl_cfree)(pcVar15);
      if (CVar13 != CURLE_OK) break;
      if (((conn->given->flags & 1) != 0) && (((ulong)conn->bits & 1) != 0)) {
        conn->bits = (ConnectBits)((ulong)conn->bits | 8);
      }
      uVar9 = (data->set).use_port;
      if ((uVar9 != 0) && (((data->state).field_0x774 & 0x10) != 0)) {
        conn->remote_port = (uint)uVar9;
        curl_msnprintf((char *)local_68,0x10,"%d");
        CVar11 = curl_url_set((data->state).uh,CURLUPART_PORT,(char *)local_68,0);
        if (CVar11 != CURLUE_OK) goto switchD_0015dfb7_caseD_7;
      }
      CVar13 = override_login(data,conn);
      if (((CVar13 != CURLE_OK) || (CVar13 = set_login(data,conn), CVar13 != CURLE_OK)) ||
         (CVar13 = parse_connect_to_slist(data,conn,(data->set).connect_to), CVar13 != CURLE_OK))
      break;
      CVar23 = conn->bits;
      if (((ulong)CVar23 & 1) != 0) {
        CVar13 = Curl_idnconvert_hostname(&(conn->http_proxy).host);
        if (CVar13 != CURLE_OK) break;
        CVar23 = conn->bits;
      }
      if (((ulong)CVar23 & 2) != 0) {
        CVar13 = Curl_idnconvert_hostname(&(conn->socks_proxy).host);
        if (CVar13 != CURLE_OK) break;
        CVar23 = conn->bits;
      }
      if ((CVar23._0_4_ >> 8 & 1) != 0) {
        CVar13 = Curl_idnconvert_hostname(&conn->conn_to_host);
        if (CVar13 != CURLE_OK) break;
        CVar23 = conn->bits;
        if ((CVar23._0_4_ >> 8 & 1) != 0) {
          iVar12 = curl_strequal((conn->conn_to_host).name,(conn->host).name);
          CVar23 = conn->bits;
          if (iVar12 != 0) {
            CVar23 = (ConnectBits)((ulong)CVar23 & 0xfffffffffffffeff);
            conn->bits = CVar23;
          }
        }
      }
      if (((CVar23._0_4_ >> 9 & 1) != 0) && (conn->conn_to_port == conn->remote_port)) {
        CVar23 = (ConnectBits)((ulong)CVar23 & 0xfffffffffffffdff);
        conn->bits = CVar23;
      }
      if (((ulong)CVar23 & 1) != 0 && ((ulong)CVar23 & 0x300) != 0) {
        conn->bits = (ConnectBits)((ulong)CVar23 | 8);
      }
      CVar13 = setup_connection_internals(data,conn);
      if (CVar13 != CURLE_OK) break;
      pCVar3 = conn->handler;
      if ((pCVar3->flags & 0x10) == 0) {
        conn->recv[0] = Curl_cf_recv;
        conn->send[0] = Curl_cf_send;
        conn->recv[1] = Curl_cf_recv;
        conn->send[1] = Curl_cf_send;
        conn->bits = (ConnectBits)
                     ((ulong)conn->bits & 0xffffffffff7fffff |
                     (ulong)((uint)((ulong)*(undefined8 *)&(data->set).field_0x8ca >> 0x10) &
                            0x800000));
        CVar13 = Curl_ssl_easy_config_complete(data);
        if (CVar13 != CURLE_OK) break;
        Curl_cpool_prune_dead(data);
        if (((((data->set).field_0x8cd & 0x40) != 0) && ((data->state).followlocation == 0)) ||
           (((data->set).connect_only != '\0' ||
            (_Var7 = ConnectionExists(data,conn,&local_38,&local_69,&local_79), conn_00 = local_38,
            !_Var7)))) {
          if (((conn->handler->flags & 0x100) != 0) && (((data->set).field_0x8cf & 1) != 0)) {
            puVar2 = &(conn->bits).field_0x3;
            *puVar2 = *puVar2 | 1;
          }
          if (local_79 == false) {
            iVar12 = Curl_cpool_check_limits(data,conn);
            if (iVar12 == 2) {
              uVar10 = (uint)*(undefined8 *)&(data->set).field_0x8ca;
              if (-1 < (data->set).dohfor_mid) {
                if (((uVar10 >> 0x1c & 1) != 0) &&
                   ((pcVar20 = (data->state).feat, pcVar20 == (curl_trc_feat *)0x0 ||
                    (0 < pcVar20->log_level)))) {
                  Curl_infof(data,"Allowing DoH to override max connection limit");
                }
                goto LAB_0015f15d;
              }
              if ((uVar10 >> 0x1c & 1) != 0) {
                pcVar20 = (data->state).feat;
                pcVar15 = "No connections available in cache";
                goto LAB_0015f270;
              }
            }
            else {
              if (iVar12 != 1) {
LAB_0015f15d:
                CVar13 = Curl_ssl_conn_config_init(data,conn);
                if (CVar13 != CURLE_OK) break;
                Curl_attach_connection(data,conn);
                CVar13 = Curl_cpool_add_conn(data,conn);
                if (CVar13 != CURLE_OK) break;
                if ((((data->state).authhost.picked & 8) != 0) &&
                   (bVar8 = (data->state).authhost.field_0x18, (bVar8 & 1) != 0)) {
                  if ((((data->set).field_0x8cd & 0x10) != 0) &&
                     ((pcVar20 = (data->state).feat, pcVar20 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar20->log_level)))) {
                    Curl_infof(data,"NTLM picked AND auth done set, clear picked");
                    bVar8 = (data->state).authhost.field_0x18;
                  }
                  (data->state).authhost.picked = 0;
                  (data->state).authhost.field_0x18 = bVar8 & 0xfe;
                }
                conn_00 = conn;
                if ((((data->state).authproxy.picked & 8) != 0) &&
                   (bVar8 = (data->state).authproxy.field_0x18, (bVar8 & 1) != 0)) {
                  if ((((data->set).field_0x8cd & 0x10) != 0) &&
                     ((pcVar20 = (data->state).feat, pcVar20 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar20->log_level)))) {
                    Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked");
                    bVar8 = (data->state).authproxy.field_0x18;
                  }
                  (data->state).authproxy.picked = 0;
                  (data->state).authproxy.field_0x18 = bVar8 & 0xfe;
                }
                goto LAB_0015ece6;
              }
              if (((data->set).field_0x8cd & 0x10) != 0) {
                pcVar20 = (data->state).feat;
                pcVar15 = "No more connections allowed to host";
LAB_0015f270:
                if ((pcVar20 == (curl_trc_feat *)0x0) || (0 < pcVar20->log_level)) {
                  Curl_infof(data,pcVar15);
                }
              }
            }
          }
          if ((((data->set).field_0x8cd & 0x10) != 0) &&
             ((pcVar20 = (data->state).feat, pcVar20 == (curl_trc_feat *)0x0 ||
              (0 < pcVar20->log_level)))) {
            Curl_infof(data,"No connections available.");
          }
          Curl_conn_free(data,conn);
          CVar13 = CURLE_NO_CONNECTION_AVAILABLE;
          conn = (connectdata *)0x0;
          break;
        }
        reuse_conn(data,conn,local_38);
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar20 = (data->state).feat, pcVar20 == (curl_trc_feat *)0x0 ||
            (0 < pcVar20->log_level)))) {
          pcVar15 = "proxy";
          if (((ulong)conn_00->bits & 0x10) == 0) {
            pcVar15 = "host";
          }
          lVar19 = 0xc0;
          if (((conn_00->socks_proxy).host.name == (char *)0x0) &&
             (lVar19 = 0xf8, (conn_00->http_proxy).host.name == (char *)0x0)) {
            lVar19 = 0x70;
          }
          Curl_infof(data,"Re-using existing connection with %s %s",pcVar15,
                     *(undefined8 *)((long)&(conn_00->cpool_node)._list + lVar19));
        }
LAB_0015ece6:
        Curl_init_do(data,conn_00);
        CVar13 = setup_range(data);
        conn = conn_00;
        if (CVar13 != CURLE_OK) break;
        if (((ulong)conn_00->bits & 0x40) == 0) {
          CVar13 = resolve_server(data,conn_00,local_48);
          if (CVar13 != CURLE_OK) break;
        }
        else {
          *local_48 = false;
        }
        pCVar3 = conn_00->handler;
        (data->info).conn_scheme = pCVar3->scheme;
        (data->info).conn_protocol = pCVar3->protocol & 0x3ffffff;
        (data->info).field_0xe4 = (data->info).field_0xe4 & 0xfd | *(byte *)&conn_00->bits >> 3 & 2;
        CVar13 = Curl_conn_ev_data_setup(data);
      }
      else {
        (data->info).conn_scheme = pCVar3->scheme;
        (data->info).conn_protocol = pCVar3->protocol & 0x3ffffff;
        CVar14 = (*pCVar3->connect_it)(data,(_Bool *)local_68);
        if (CVar14 == CURLE_OK) {
          Curl_attach_connection(data,conn);
          CVar13 = Curl_cpool_add_conn(data,conn);
          if (CVar13 == CURLE_OK) {
            CVar13 = setup_range(data);
            if (CVar13 == CURLE_OK) {
              Curl_xfer_setup_nop(data);
              goto LAB_0015efe4;
            }
            (*conn->handler->done)(data,CVar13,false);
          }
        }
        else {
LAB_0015efe4:
          Curl_init_do(data,conn);
          CVar13 = CVar14;
        }
      }
      if (CVar13 == CURLE_OK) {
        sVar16 = Curl_llist_count(&conn->easyq);
        if (1 < sVar16) {
          *local_40 = true;
          return CURLE_OK;
        }
        if (*local_48 != false) {
          return CURLE_OK;
        }
        CVar13 = Curl_setup_conn(data,local_40);
      }
    default:
      break;
    case CURLUE_UNSUPPORTED_SCHEME:
      goto switchD_0015dfb7_caseD_5;
    case CURLUE_OUT_OF_MEMORY:
      goto switchD_0015dfb7_caseD_7;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_0015dfb7_caseD_8;
    }
  default:
    if (CVar11 != CURLUE_OK) break;
    pcVar15 = (*Curl_cstrdup)(*ppcVar1);
    conn->options = pcVar15;
    if (pcVar15 != (char *)0x0) goto switchD_0015e3e7_caseD_d;
  case CURLUE_OUT_OF_MEMORY:
switchD_0015dfb7_caseD_7:
    CVar13 = CURLE_OUT_OF_MEMORY;
  }
switchD_0015dfb7_caseD_1:
  CVar14 = CURLE_NO_CONNECTION_AVAILABLE;
  if (((CVar13 != CURLE_NO_CONNECTION_AVAILABLE) && (CVar14 = CVar13, conn != (connectdata *)0x0))
     && (CVar13 != CURLE_OK)) {
    Curl_detach_connection(data);
    Curl_cpool_disconnect(data,conn,true);
  }
  return CVar14;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;
  struct connectdata *conn;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* Set the request to virgin state based on transfer settings */
  Curl_req_hard_reset(&data->req, data);

  /* call the stuff that needs to be called */
  result = create_conn(data, &conn, asyncp);

  if(!result) {
    if(CONN_INUSE(conn) > 1)
      /* multiplexed */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that is either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(data, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    return result;
  }
  else if(result && conn) {
    /* We are not allowed to return failure with memory left allocated in the
       connectdata struct, free those here */
    Curl_detach_connection(data);
    Curl_cpool_disconnect(data, conn, TRUE);
  }

  return result;
}